

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_slang::ast::SymbolKind_&,_const_slang::ast::SymbolKind_&>::
streamReconstructedExpression
          (BinaryExpr<const_slang::ast::SymbolKind_&,_const_slang::ast::SymbolKind_&> *this,
          ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SymbolKind>::value,_std::string> local_60;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SymbolKind>::value,_std::string> local_40;
  
  StringMaker<slang::ast::SymbolKind,_void>::convert<slang::ast::SymbolKind>(&local_40,this->m_lhs);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<slang::ast::SymbolKind,_void>::convert<slang::ast::SymbolKind>(&local_60,this->m_rhs);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }